

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O0

bool __thiscall
cmCMakePolicyCommand::HandleGetMode
          (cmCMakePolicyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  size_type sVar3;
  const_reference __lhs;
  char *id_00;
  ostream *poVar4;
  PolicyID id_01;
  string local_3d0;
  string local_3b0;
  undefined1 local_390 [8];
  ostringstream e_1;
  undefined1 local_210 [4];
  PolicyStatus status;
  ostringstream local_1f0 [8];
  ostringstream e;
  PolicyID local_74;
  const_reference pvStack_70;
  PolicyID pid;
  string *var;
  string *id;
  allocator<char> local_49;
  string local_48;
  byte local_21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  bool parent_scope;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCMakePolicyCommand *this_local;
  
  local_21 = 0;
  pvStack_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 == 4) {
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](pvStack_20,3);
    bVar1 = std::operator==(__lhs,"PARENT_SCOPE");
    if (!bVar1) goto LAB_00310d5d;
    local_21 = 1;
  }
  else {
LAB_00310d5d:
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvStack_20);
    if (sVar3 != 3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"GET must be given exactly 2 additional arguments.",&local_49);
      cmCommand::SetError(&this->super_cmCommand,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
      this_local._7_1_ = 0;
      goto LAB_00311173;
    }
  }
  var = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](pvStack_20,1);
  pvStack_70 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvStack_20,2);
  id_00 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmPolicies::GetPolicyID(id_00,&local_74);
  if (bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus
                      ((this->super_cmCommand).Makefile,local_74,(bool)(local_21 & 1));
    switch(PVar2) {
    case OLD:
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pvStack_70,"OLD");
      break;
    case WARN:
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pvStack_70,"");
      break;
    case NEW:
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pvStack_70,"NEW");
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_390);
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_3b0,(cmPolicies *)(ulong)local_74,id_01);
      poVar4 = std::operator<<((ostream *)local_390,(string *)&local_3b0);
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"The call to cmake_policy(GET ");
      poVar4 = std::operator<<(poVar4,(string *)var);
      poVar4 = std::operator<<(poVar4," ...) at which this ");
      poVar4 = std::operator<<(poVar4,
                               "error appears requests the policy, and this version of CMake ");
      std::operator<<(poVar4,"requires that the policy be set to NEW before it is checked.");
      std::__cxx11::string::~string((string *)&local_3b0);
      this_00 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_3d0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_390);
    }
    this_local._7_1_ = 1;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1f0);
    poVar4 = std::operator<<((ostream *)local_1f0,"GET given policy \"");
    poVar4 = std::operator<<(poVar4,(string *)var);
    poVar4 = std::operator<<(poVar4,"\" which is not known to this ");
    std::operator<<(poVar4,"version of CMake.");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,(string *)local_210);
    std::__cxx11::string::~string((string *)local_210);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_1f0);
  }
LAB_00311173:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCMakePolicyCommand::HandleGetMode(std::vector<std::string> const& args)
{
  bool parent_scope = false;
  if (args.size() == 4 && args[3] == "PARENT_SCOPE") {
    // Undocumented PARENT_SCOPE option for use within CMake.
    parent_scope = true;
  } else if (args.size() != 3) {
    this->SetError("GET must be given exactly 2 additional arguments.");
    return false;
  }

  // Get arguments.
  std::string const& id = args[1];
  std::string const& var = args[2];

  // Lookup the policy number.
  cmPolicies::PolicyID pid;
  if (!cmPolicies::GetPolicyID(id.c_str(), pid)) {
    std::ostringstream e;
    e << "GET given policy \"" << id << "\" which is not known to this "
      << "version of CMake.";
    this->SetError(e.str());
    return false;
  }

  // Lookup the policy setting.
  cmPolicies::PolicyStatus status =
    this->Makefile->GetPolicyStatus(pid, parent_scope);
  switch (status) {
    case cmPolicies::OLD:
      // Report that the policy is set to OLD.
      this->Makefile->AddDefinition(var, "OLD");
      break;
    case cmPolicies::WARN:
      // Report that the policy is not set.
      this->Makefile->AddDefinition(var, "");
      break;
    case cmPolicies::NEW:
      // Report that the policy is set to NEW.
      this->Makefile->AddDefinition(var, "NEW");
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      // The policy is required to be set before anything needs it.
      {
        std::ostringstream e;
        e << cmPolicies::GetRequiredPolicyError(pid) << "\n"
          << "The call to cmake_policy(GET " << id << " ...) at which this "
          << "error appears requests the policy, and this version of CMake "
          << "requires that the policy be set to NEW before it is checked.";
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      }
  }

  return true;
}